

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O1

void Omega_h::repro_sum(CommPtr *comm,Reals *a,Int ncomps,Real *result)

{
  int *piVar1;
  Alloc *pAVar2;
  ulong uVar3;
  Real RVar4;
  Read<double> local_68;
  CommPtr local_58;
  Real *local_48;
  Alloc *local_40 [2];
  
  if (0 < ncomps) {
    uVar3 = 0;
    local_48 = result;
    do {
      local_58.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_58.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
      if (local_58.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_58.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
          ->_M_use_count =
               (local_58.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_58.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
          ->_M_use_count =
               (local_58.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi)->_M_use_count + 1;
        }
      }
      local_68.write_.shared_alloc_.alloc = (a->write_).shared_alloc_.alloc;
      if (((ulong)local_68.write_.shared_alloc_.alloc & 7) == 0 &&
          local_68.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_68.write_.shared_alloc_.alloc =
               (Alloc *)((local_68.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_68.write_.shared_alloc_.alloc)->use_count =
               (local_68.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_68.write_.shared_alloc_.direct_ptr = (a->write_).shared_alloc_.direct_ptr;
      get_component<double>((Omega_h *)local_40,&local_68,ncomps,(Int)uVar3);
      RVar4 = repro_sum(&local_58,(Reals *)local_40);
      pAVar2 = local_40[0];
      local_48[uVar3] = RVar4;
      if (((ulong)local_40[0] & 7) == 0 && local_40[0] != (Alloc *)0x0) {
        piVar1 = &local_40[0]->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_40[0]);
          operator_delete(pAVar2,0x48);
        }
      }
      pAVar2 = local_68.write_.shared_alloc_.alloc;
      if (((ulong)local_68.write_.shared_alloc_.alloc & 7) == 0 &&
          local_68.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_68.write_.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_68.write_.shared_alloc_.alloc);
          operator_delete(pAVar2,0x48);
        }
      }
      if (local_58.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_58.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      uVar3 = uVar3 + 1;
    } while ((uint)ncomps != uVar3);
  }
  return;
}

Assistant:

void repro_sum(CommPtr comm, Reals a, Int ncomps, Real result[]) {
  for (Int comp = 0; comp < ncomps; ++comp) {
    result[comp] = repro_sum(comm, get_component(a, ncomps, comp));
  }
}